

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(Impl *this,Reader node)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ArrayPtr<capnp::word> AVar4;
  Entry *local_30;
  
  if (((0x6f < node._reader.dataSize) && (*(short *)((long)node._reader.data + 0xc) == 1)) &&
     (kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::find<unsigned_long>
                ((HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize> *)
                 &stack0xffffffffffffffd0,(unsigned_long *)&this->structSizeRequirements),
     local_30 != (Entry *)0x0)) {
    if (node._reader.dataSize < 0x80) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)((long)node._reader.data + 0xe);
    }
    uVar1 = (ushort)local_30->key;
    if (uVar3 < uVar1) {
      uVar2 = *(ushort *)((long)&local_30->key + 2);
    }
    else {
      if (node._reader.dataSize < 0xd0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)((long)node._reader.data + 0x18);
      }
      uVar2 = *(ushort *)((long)&local_30->key + 2);
      if (uVar2 <= uVar3) goto LAB_001336f2;
    }
    AVar4 = rewriteStructNodeWithSizes(this,node,(uint)uVar1,(uint)uVar2);
    return AVar4;
  }
LAB_001336f2:
  AVar4 = makeUncheckedNode(this,node);
  return AVar4;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(
    schema::Node::Reader node) {
  if (node.isStruct()) {
    KJ_IF_SOME(requirement, structSizeRequirements.find(node.getId())) {
      auto structNode = node.getStruct();
      if (structNode.getDataWordCount() < requirement.dataWordCount ||
          structNode.getPointerCount() < requirement.pointerCount) {
        return rewriteStructNodeWithSizes(node, requirement.dataWordCount,
                                          requirement.pointerCount);
      }
    }
  }

  return makeUncheckedNode(node);
}